

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O3

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  uint extraout_EAX;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [32];
  long lVar11;
  int iVar12;
  float fVar13;
  undefined1 auVar14 [32];
  __m512 afVar15;
  undefined1 auVar17 [56];
  undefined1 auVar16 [64];
  __m128 afVar18;
  binary_op_pow op;
  __m512 _p1;
  __m512 _p;
  binary_op_pow local_165;
  int local_164;
  void *local_160;
  void *local_158;
  Mat *local_150;
  long local_148;
  long local_140;
  long local_138;
  void *local_130;
  Mat *local_128;
  long local_120;
  Mat *local_118;
  long local_110;
  void *local_108;
  __m512 local_100;
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [2];
  float afStack_a0 [2];
  float afStack_98 [2];
  float afStack_90 [2];
  float afStack_88 [22];
  
  uVar4 = a->c;
  local_120 = (long)(int)uVar4;
  if (0 < local_120) {
    local_164 = a->h * a->w * a->d * a->elempack;
    local_110 = 0;
    local_150 = a;
    local_128 = c;
    local_118 = b;
    do {
      pvVar1 = local_150->data;
      pvVar2 = local_118->data;
      local_158 = (void *)local_118->elemsize;
      pvVar3 = local_128->data;
      local_160 = (void *)local_128->elemsize;
      if (local_164 < 0x10) {
        pfVar8 = (float *)((long)pvVar1 + local_150->cstep * local_110 * local_150->elemsize);
        lVar7 = local_118->cstep * local_110 * (long)local_158;
        lVar11 = local_128->cstep * local_110 * (long)local_160;
        uVar5 = 0;
      }
      else {
        local_148 = local_150->cstep * local_150->elemsize * local_110;
        local_108 = (void *)(local_148 + (long)pvVar1);
        local_140 = local_118->cstep * (long)local_158 * local_110;
        local_158 = (void *)((long)pvVar2 + local_140);
        local_138 = local_128->cstep * (long)local_160 * local_110;
        local_160 = (void *)(local_138 + (long)pvVar3);
        lVar11 = 0;
        uVar4 = 0;
        local_130 = pvVar1;
        do {
          pfVar8 = (float *)((long)local_108 + lVar11);
          local_c0 = *(float (*) [2])pfVar8;
          afStack_b8 = *(float (*) [2])(pfVar8 + 2);
          afStack_b0 = *(float (*) [2])(pfVar8 + 4);
          afStack_a8 = *(float (*) [2])(pfVar8 + 6);
          afStack_a0 = *(float (*) [2])(pfVar8 + 8);
          afStack_98 = *(float (*) [2])(pfVar8 + 10);
          afStack_90 = *(float (*) [2])(pfVar8 + 0xc);
          afStack_88._0_8_ = *(undefined8 *)(pfVar8 + 0xe);
          afVar15 = *(__m512 *)((long)local_158 + lVar11);
          local_100 = afVar15;
          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                    (&local_165,(__m512 *)local_c0,&local_100);
          *(__m512 *)((long)local_160 + lVar11) = afVar15;
          uVar5 = uVar4 + 0x10;
          lVar11 = lVar11 + 0x40;
          iVar12 = uVar4 + 0x1f;
          uVar4 = uVar5;
        } while (iVar12 < local_164);
        pfVar8 = (float *)((long)local_130 + local_148 + lVar11);
        lVar7 = local_140 + lVar11;
        lVar11 = local_138 + lVar11;
      }
      pauVar10 = (undefined1 (*) [32])((long)pvVar3 + lVar11);
      pauVar9 = (undefined1 (*) [32])((long)pvVar2 + lVar7);
      uVar4 = uVar5;
      if ((int)(uVar5 | 7) < local_164) {
        do {
          local_c0 = *(float (*) [2])pfVar8;
          afStack_b8 = *(float (*) [2])(pfVar8 + 2);
          afStack_b0 = *(float (*) [2])(pfVar8 + 4);
          afStack_a8 = *(float (*) [2])(pfVar8 + 6);
          auVar14 = *pauVar9;
          local_100[0] = (float)auVar14._0_4_;
          local_100[1] = (float)auVar14._4_4_;
          local_100[2] = (float)auVar14._8_4_;
          local_100[3] = (float)auVar14._12_4_;
          local_100[4] = (float)auVar14._16_4_;
          local_100[5] = (float)auVar14._20_4_;
          local_100[6] = (float)auVar14._24_4_;
          local_100[7] = (float)auVar14._28_4_;
          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                    (&local_165,(__m256 *)local_c0,(__m256 *)local_100);
          *pauVar10 = auVar14;
          pfVar8 = pfVar8 + 8;
          pauVar9 = pauVar9 + 1;
          pauVar10 = pauVar10 + 1;
          uVar5 = uVar4 + 8;
          iVar12 = uVar4 + 0xf;
          uVar4 = uVar5;
        } while (iVar12 < local_164);
      }
      uVar6 = uVar5;
      uVar4 = uVar5 | 3;
      if ((int)(uVar5 | 3) < local_164) {
        do {
          local_c0 = *(float (*) [2])pfVar8;
          afStack_b8 = *(float (*) [2])(pfVar8 + 2);
          local_100._0_16_ = *(undefined1 (*) [16])*pauVar9;
          auVar17 = ZEXT856(*(ulong *)(*pauVar9 + 8));
          afVar18 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                              (&local_165,(__m128 *)local_c0,(__m128 *)local_100);
          auVar16._0_8_ = afVar18._0_8_;
          auVar16._8_56_ = auVar17;
          *(undefined1 (*) [16])*pauVar10 = auVar16._0_16_;
          pfVar8 = pfVar8 + 4;
          pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
          pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
          uVar5 = uVar6 + 4;
          iVar12 = uVar6 + 7;
          uVar6 = uVar5;
          uVar4 = uVar5;
        } while (iVar12 < local_164);
      }
      iVar12 = local_164 - uVar5;
      if ((int)uVar5 < local_164) {
        lVar7 = 0;
        do {
          fVar13 = powf(pfVar8[lVar7],*(float *)(*pauVar9 + lVar7 * 4));
          *(float *)(*pauVar10 + lVar7 * 4) = fVar13;
          lVar7 = lVar7 + 1;
          uVar4 = extraout_EAX;
        } while (iVar12 != (int)lVar7);
      }
      local_110 = local_110 + 1;
    } while (local_110 != local_120);
  }
  return uVar4;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}